

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::Error(TestResponseProxy *this,int line,char *file,string *message)

{
  char *this_00;
  
  gnilk::Log::Error<char_const*,char_const*,int,char_const*>
            (this->pLogger,"%s:%d\t\'%s\'",file,line,(message->_M_dataplus)._M_p);
  this_00 = "*** GENERAL ERROR: %s:%d\t\'%s\'\n";
  printf("*** GENERAL ERROR: %s:%d\t\'%s\'\n",file,line,(message->_M_dataplus)._M_p);
  this->errorCount = this->errorCount + 1;
  if (this->testResult == kTestResult_Pass) {
    this->testResult = kTestResult_TestFail;
  }
  TerminateThreadIfNeeded((TestResponseProxy *)this_00);
  return;
}

Assistant:

void TestResponseProxy::Error(int line, const char *file, std::string message) {
    pLogger->Error("%s:%d\t'%s'", file, line, message.c_str());

    printf("*** GENERAL ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_TestFail) {
        testResult = kTestResult_TestFail;
    }
    TerminateThreadIfNeeded();
}